

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t *
extent_try_coalesce_impl
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,rtree_ctx_t *rtree_ctx,
          extents_t *extents,extent_t *extent,_Bool *coalesced,_Bool growing_retained,
          _Bool inactive_only)

{
  byte bVar1;
  _Bool _Var2;
  extents_t *extents_00;
  byte bVar3;
  extents_t *in_RCX;
  arena_t *in_RDI;
  tsdn_t *in_R8;
  arena_t *in_R9;
  undefined1 *in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  _Bool can_coalesce_1;
  extent_t *prev;
  _Bool can_coalesce;
  extent_t *next;
  _Bool again;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  arena_t *in_stack_ffffffffffffff68;
  extents_t *in_stack_ffffffffffffff70;
  arena_t *arena_00;
  extents_t *tsdn_00;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  arena_t *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  undefined5 in_stack_ffffffffffffffc0;
  byte bVar4;
  
  bVar3 = in_stack_00000010 & 1;
  bVar1 = in_stack_00000018 & 1;
  do {
    bVar4 = 0;
    arena_00 = in_RDI;
    tsdn_00 = in_RCX;
    extent_past_get((extent_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    extents_00 = (extents_t *)
                 extent_lock_from_addr
                           ((tsdn_t *)tsdn_00,(rtree_ctx_t *)arena_00,in_stack_ffffffffffffff70,
                            SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
    if (extents_00 != (extents_t *)0x0) {
      in_stack_ffffffffffffffb7 =
           extent_can_coalesce(arena_00,in_stack_ffffffffffffff70,
                               (extent_t *)in_stack_ffffffffffffff68,
                               (extent_t *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      extent_unlock((tsdn_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (extent_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if ((in_stack_ffffffffffffffb7 & 1) != 0) {
        in_stack_ffffffffffffff58 = 1;
        in_stack_ffffffffffffff60 = (uint)(bVar3 & 1);
        _Var2 = extent_coalesce(in_R8,in_R9,
                                (extent_hooks_t **)
                                CONCAT17(bVar3,CONCAT16(bVar1,CONCAT15(bVar4,
                                                  in_stack_ffffffffffffffc0))),extents_00,
                                (extent_t *)
                                CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                (extent_t *)in_stack_ffffffffffffffa8,
                                (_Bool)in_stack_ffffffffffffffa7,(_Bool)in_stack_ffffffffffffffa6);
        if (!_Var2) {
          if (((in_R8->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large
               [0x90].tstats.nrequests & 0x100000000) != 0) {
            *in_stack_00000008 = 1;
            return (extent_t *)in_R9;
          }
          bVar4 = 1;
        }
      }
    }
    in_stack_ffffffffffffff68 = in_RDI;
    in_stack_ffffffffffffff70 = in_RCX;
    extent_before_get((extent_t *)0x16c0e5);
    in_stack_ffffffffffffffa8 =
         (arena_t *)
         extent_lock_from_addr
                   ((tsdn_t *)tsdn_00,(rtree_ctx_t *)arena_00,in_stack_ffffffffffffff70,
                    SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
    if (in_stack_ffffffffffffffa8 != (arena_t *)0x0) {
      in_stack_ffffffffffffffa7 =
           extent_can_coalesce(arena_00,in_stack_ffffffffffffff70,
                               (extent_t *)in_stack_ffffffffffffff68,
                               (extent_t *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      extent_unlock((tsdn_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (extent_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      if ((in_stack_ffffffffffffffa7 & 1) != 0) {
        in_stack_ffffffffffffff58 = 0;
        in_stack_ffffffffffffff60 = (uint)(bVar3 & 1);
        _Var2 = extent_coalesce(in_R8,in_R9,
                                (extent_hooks_t **)
                                CONCAT17(bVar3,CONCAT16(bVar1,CONCAT15(bVar4,
                                                  in_stack_ffffffffffffffc0))),extents_00,
                                (extent_t *)
                                CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                (extent_t *)in_stack_ffffffffffffffa8,
                                (_Bool)in_stack_ffffffffffffffa7,(_Bool)in_stack_ffffffffffffffa6);
        if (!_Var2) {
          if (((in_R8->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large
               [0x90].tstats.nrequests & 0x100000000) != 0) {
            *in_stack_00000008 = 1;
            return (extent_t *)in_stack_ffffffffffffffa8;
          }
          bVar4 = 1;
          in_R9 = in_stack_ffffffffffffffa8;
        }
      }
    }
  } while ((bVar4 & 1) != 0);
  if (((in_R8->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large[0x90].
       tstats.nrequests & 0x100000000) != 0) {
    *in_stack_00000008 = 0;
  }
  return (extent_t *)in_R9;
}

Assistant:

static extent_t *
extent_try_coalesce_impl(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, rtree_ctx_t *rtree_ctx, extents_t *extents,
    extent_t *extent, bool *coalesced, bool growing_retained,
    bool inactive_only) {
	/*
	 * We avoid checking / locking inactive neighbors for large size
	 * classes, since they are eagerly coalesced on deallocation which can
	 * cause lock contention.
	 */
	/*
	 * Continue attempting to coalesce until failure, to protect against
	 * races with other threads that are thwarted by this one.
	 */
	bool again;
	do {
		again = false;

		/* Try to coalesce forward. */
		extent_t *next = extent_lock_from_addr(tsdn, rtree_ctx,
		    extent_past_get(extent), inactive_only);
		if (next != NULL) {
			/*
			 * extents->mtx only protects against races for
			 * like-state extents, so call extent_can_coalesce()
			 * before releasing next's pool lock.
			 */
			bool can_coalesce = extent_can_coalesce(arena, extents,
			    extent, next);

			extent_unlock(tsdn, next);

			if (can_coalesce && !extent_coalesce(tsdn, arena,
			    r_extent_hooks, extents, extent, next, true,
			    growing_retained)) {
				if (extents->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return extent;
				}
				again = true;
			}
		}

		/* Try to coalesce backward. */
		extent_t *prev = extent_lock_from_addr(tsdn, rtree_ctx,
		    extent_before_get(extent), inactive_only);
		if (prev != NULL) {
			bool can_coalesce = extent_can_coalesce(arena, extents,
			    extent, prev);
			extent_unlock(tsdn, prev);

			if (can_coalesce && !extent_coalesce(tsdn, arena,
			    r_extent_hooks, extents, extent, prev, false,
			    growing_retained)) {
				extent = prev;
				if (extents->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return extent;
				}
				again = true;
			}
		}
	} while (again);

	if (extents->delay_coalesce) {
		*coalesced = false;
	}
	return extent;
}